

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

exr_result_t generic_unpack_deep(exr_decode_pipeline_t *decode)

{
  char cVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  exr_coding_channel_info_t *peVar7;
  bool bVar8;
  uint uVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ushort uVar17;
  int iVar18;
  uint uVar19;
  float fVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  void *pvVar24;
  float *pfVar25;
  ulong uVar26;
  long lVar27;
  int32_t *piVar28;
  bool bVar29;
  
  iVar3 = (decode->chunk).height;
  iVar4 = decode->user_line_end_ignore;
  if (iVar4 < iVar3) {
    iVar5 = decode->user_line_begin_skip;
    uVar6 = (decode->chunk).width;
    piVar28 = decode->sample_count_table;
    pvVar24 = decode->unpacked_buffer;
    uVar17 = decode->channel_count;
    lVar23 = 0;
    iVar22 = 0;
    do {
      if (0 < (short)uVar17) {
        uVar15 = (ulong)uVar17;
        peVar7 = decode->channels;
        uVar16 = 0;
        do {
          bVar8 = iVar22 < iVar5;
          uVar26 = uVar16 + 1;
          bVar29 = uVar26 != (uVar15 & 0xffffffff);
          cVar1 = peVar7[uVar16].bytes_per_element;
          if (peVar7[uVar16].field_12.decode_to_ptr == (uint8_t *)0x0) {
            if ((decode->decode_flags & 1) == 0) {
              iVar18 = piVar28[(long)(int)uVar6 + -1];
            }
            else if ((int)uVar6 < 1) {
              iVar18 = 0;
            }
            else {
              uVar16 = 0;
              iVar18 = 0;
              do {
                iVar18 = iVar18 + piVar28[uVar16];
                uVar16 = uVar16 + 1;
              } while (uVar6 != uVar16);
            }
            pvVar24 = (void *)((long)pvVar24 + (long)cVar1 * (long)iVar18);
            lVar27 = (long)iVar18;
            if (bVar29 || bVar8) {
              lVar27 = 0;
            }
            lVar23 = lVar23 + lVar27;
          }
          else if (0 < (int)uVar6) {
            lVar27 = (long)peVar7[uVar16].user_bytes_per_element;
            pfVar25 = (float *)(peVar7[uVar16].field_12.decode_to_ptr + lVar23 * lVar27);
            uVar15 = 0;
            iVar18 = 0;
            do {
              iVar11 = iVar18;
              iVar12 = piVar28[uVar15];
              if ((decode->decode_flags & 1) != 0) {
                iVar11 = 0;
                iVar12 = iVar18;
              }
              iVar18 = iVar12;
              iVar11 = piVar28[uVar15] - iVar11;
              uVar2 = peVar7[uVar16].data_type;
              if (uVar2 == 0) {
                uVar2 = peVar7[uVar16].user_data_type;
                if (uVar2 == 2) {
                  if (0 < iVar11) {
                    lVar14 = 0;
                    do {
                      *pfVar25 = (float)*(uint *)((long)pvVar24 + lVar14 * 4);
                      pfVar25 = (float *)((long)pfVar25 + lVar27);
                      lVar14 = lVar14 + 1;
                    } while (iVar11 != (int)lVar14);
                  }
                }
                else if (uVar2 == 1) {
                  if (0 < iVar11) {
                    lVar14 = 0;
                    do {
                      uVar21 = *(uint *)((long)pvVar24 + lVar14 * 4);
                      uVar17 = 0x7c00;
                      if (uVar21 < 0xffe1) {
                        fVar20 = (float)(int)uVar21;
                        if ((uint)fVar20 < 0x38800000) {
                          if ((uint)fVar20 < 0x33000001) {
                            uVar17 = 0;
                          }
                          else {
                            uVar21 = (uint)fVar20 & 0x7fffff | 0x800000;
                            cVar10 = (char)((uint)fVar20 >> 0x17);
                            uVar17 = (ushort)(uVar21 >> (0x7eU - cVar10 & 0x1f));
                            if (0x80000000 < uVar21 << (cVar10 + 0xa2U & 0x1f)) {
                              uVar17 = uVar17 + 1;
                            }
                          }
                        }
                        else if ((uint)fVar20 < 0x7f800000) {
                          if ((uint)fVar20 < 0x477ff000) {
                            uVar17 = (ushort)((int)fVar20 + 0x8000fff +
                                              (uint)(((uint)fVar20 >> 0xd & 1) != 0) >> 0xd);
                          }
                        }
                        else if (fVar20 != INFINITY) {
                          uVar21 = (uint)fVar20 >> 0xd & 0x3ff;
                          uVar17 = (ushort)(uVar21 == 0) | (ushort)uVar21 | 0x7c00;
                        }
                      }
                      *(ushort *)pfVar25 = uVar17;
                      pfVar25 = (float *)((long)pfVar25 + lVar27);
                      lVar14 = lVar14 + 1;
                    } while (iVar11 != (int)lVar14);
                  }
                }
                else {
                  if (uVar2 != 0) {
                    return 3;
                  }
                  if (0 < iVar11) {
                    lVar14 = 0;
                    do {
                      *pfVar25 = *(float *)((long)pvVar24 + lVar14 * 4);
                      pfVar25 = (float *)((long)pfVar25 + lVar27);
                      lVar14 = lVar14 + 1;
                    } while (iVar11 != (int)lVar14);
                  }
                }
              }
              else if (uVar2 == 2) {
                uVar2 = peVar7[uVar16].user_data_type;
                if (uVar2 == 2) {
                  if (0 < iVar11) {
                    lVar14 = 0;
                    do {
                      *pfVar25 = *(float *)((long)pvVar24 + lVar14 * 4);
                      pfVar25 = (float *)((long)pfVar25 + lVar27);
                      lVar14 = lVar14 + 1;
                    } while (iVar11 != (int)lVar14);
                  }
                }
                else if (uVar2 == 1) {
                  if (0 < iVar11) {
                    lVar14 = 0;
                    do {
                      uVar21 = *(uint *)((long)pvVar24 + lVar14 * 4);
                      uVar19 = uVar21 & 0x7fffffff;
                      uVar17 = (ushort)(uVar21 >> 0x10) & 0x8000;
                      if (uVar19 < 0x38800000) {
                        if ((0x33000000 < uVar19) &&
                           (uVar21 = uVar21 & 0x7fffff | 0x800000, cVar10 = (char)(uVar19 >> 0x17),
                           uVar17 = uVar17 | (ushort)(uVar21 >> (0x7eU - cVar10 & 0x1f)),
                           0x80000000 < uVar21 << (cVar10 + 0xa2U & 0x1f))) {
                          uVar17 = uVar17 + 1;
                        }
                      }
                      else if (uVar19 < 0x7f800000) {
                        if (uVar19 < 0x477ff000) {
                          uVar17 = (ushort)(uVar19 + 0x8000fff + (uint)((uVar19 >> 0xd & 1) != 0) >>
                                           0xd) | uVar17;
                        }
                        else {
                          uVar17 = uVar17 | 0x7c00;
                        }
                      }
                      else {
                        uVar17 = uVar17 | 0x7c00;
                        if (uVar19 != 0x7f800000) {
                          uVar21 = uVar19 >> 0xd & 0x3ff;
                          uVar17 = uVar17 | (ushort)uVar21 | (ushort)(uVar21 == 0);
                        }
                      }
                      *(ushort *)pfVar25 = uVar17;
                      pfVar25 = (float *)((long)pfVar25 + lVar27);
                      lVar14 = lVar14 + 1;
                    } while (iVar11 != (int)lVar14);
                  }
                }
                else {
                  if (uVar2 != 0) {
                    return 3;
                  }
                  if (0 < iVar11) {
                    lVar14 = 0;
                    do {
                      fVar20 = *(float *)((long)pvVar24 + lVar14 * 4);
                      fVar13 = 0.0;
                      if (0.0 <= fVar20) {
                        fVar13 = (float)(long)fVar20;
                        if (ABS(fVar20) == INFINITY) {
                          fVar13 = -NAN;
                        }
                        if (4.2949673e+09 < fVar20) {
                          fVar13 = -NAN;
                        }
                      }
                      *pfVar25 = fVar13;
                      pfVar25 = (float *)((long)pfVar25 + lVar27);
                      lVar14 = lVar14 + 1;
                    } while (iVar11 != (int)lVar14);
                  }
                }
              }
              else {
                if (uVar2 != 1) {
                  return 3;
                }
                uVar2 = peVar7[uVar16].user_data_type;
                if (uVar2 == 2) {
                  if (0 < iVar11) {
                    lVar14 = 0;
                    do {
                      uVar21 = (uint)*(short *)((long)pvVar24 + lVar14 * 2);
                      uVar19 = (uVar21 & 0x7fff) << 0xd;
                      fVar20 = (float)(uVar21 & 0x80000000);
                      if (uVar19 < 0x800000) {
                        if ((uVar21 & 0x7fff) != 0) {
                          uVar9 = 0x1f;
                          if ((uVar21 & 0x7fff) != 0) {
                            for (; uVar19 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                            }
                          }
                          iVar12 = (uVar9 ^ 0x1f) - 8;
                          fVar20 = (float)(((uint)fVar20 | uVar19 << ((byte)iVar12 & 0x1f) |
                                           0x38800000) + iVar12 * -0x800000);
                        }
                      }
                      else if (uVar19 < 0xf800000) {
                        fVar20 = (float)(((uint)fVar20 | uVar19) + 0x38000000);
                      }
                      else {
                        fVar20 = (float)((uint)fVar20 | uVar19 | 0x7f800000);
                      }
                      *pfVar25 = fVar20;
                      pfVar25 = (float *)((long)pfVar25 + lVar27);
                      lVar14 = lVar14 + 1;
                    } while (iVar11 != (int)lVar14);
                  }
                }
                else if (uVar2 == 1) {
                  if (0 < iVar11) {
                    lVar14 = 0;
                    do {
                      *(ushort *)pfVar25 = *(ushort *)((long)pvVar24 + lVar14 * 2);
                      pfVar25 = (float *)((long)pfVar25 + lVar27);
                      lVar14 = lVar14 + 1;
                    } while (iVar11 != (int)lVar14);
                  }
                }
                else {
                  if (uVar2 != 0) {
                    return 3;
                  }
                  if (0 < iVar11) {
                    lVar14 = 0;
                    do {
                      uVar17 = *(ushort *)((long)pvVar24 + lVar14 * 2);
                      uVar21 = (uint)uVar17;
                      if ((short)uVar17 < 0) {
                        fVar20 = 0.0;
                      }
                      else if ((~uVar21 & 0x7c00) == 0) {
                        fVar20 = (float)-(uint)((uVar17 & 0x3ff) == 0);
                      }
                      else {
                        uVar19 = uVar21 * 0x2000;
                        if (uVar21 < 0x400) {
                          if (uVar17 == 0) {
                            fVar20 = 0.0;
                          }
                          else {
                            uVar9 = 0x1f;
                            if (uVar21 != 0) {
                              for (; uVar19 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                              }
                            }
                            iVar12 = (uVar9 ^ 0x1f) - 8;
                            fVar20 = (float)((uVar19 << ((byte)iVar12 & 0x1f) | 0x38800000) +
                                            iVar12 * -0x800000);
                          }
                        }
                        else if (uVar21 < 0x7c00) {
                          fVar20 = (float)(uVar19 + 0x38000000);
                        }
                        else {
                          fVar20 = (float)(uVar19 | 0x7f800000);
                        }
                        fVar20 = (float)(long)fVar20;
                      }
                      *pfVar25 = fVar20;
                      pfVar25 = (float *)((long)pfVar25 + lVar27);
                      lVar14 = lVar14 + 1;
                    } while (iVar11 != (int)lVar14);
                  }
                }
              }
              pvVar24 = (void *)((long)pvVar24 + (long)iVar11 * (long)cVar1);
              lVar14 = (long)iVar11;
              if (bVar29 || bVar8) {
                lVar14 = 0;
              }
              lVar23 = lVar23 + lVar14;
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar6);
            uVar17 = decode->channel_count;
          }
          uVar15 = (ulong)(short)uVar17;
          uVar16 = uVar26;
        } while ((long)uVar26 < (long)uVar15);
      }
      piVar28 = piVar28 + (int)uVar6;
      iVar22 = iVar22 + 1;
    } while (iVar22 != iVar3 - iVar4);
  }
  return 0;
}

Assistant:

static exr_result_t
generic_unpack_deep (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer  = decode->unpacked_buffer;
    const int32_t* sampbuffer = decode->sample_count_table;
    uint8_t*       cdata;
    int            w, h, bpc, ubpc, uls;
    size_t         totsamps = 0;

    w = decode->chunk.width;
    h = decode->chunk.height - decode->user_line_end_ignore;

    /* for user line skip, we use y in the loop so account for that */
    uls = decode->user_line_begin_skip;

    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc      = (decode->channels + c);
            int32_t                    prevsamps = 0;

            int incr_tot = (y >= uls && ((c + 1) == decode->channel_count));

            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_bytes_per_element;
            cdata = decc->decode_to_ptr;

            if (!cdata)
            {
                prevsamps = 0;
                if ((decode->decode_flags &
                     EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    for (int x = 0; x < w; ++x)
                        prevsamps += sampbuffer[x];
                }
                else
                    prevsamps = sampbuffer[w - 1];

                srcbuffer += ((size_t) bpc) * ((size_t) prevsamps);

                if (incr_tot) totsamps += (size_t) prevsamps;

                continue;
            }

            cdata += totsamps * ((size_t) ubpc);

            for (int x = 0; x < w; ++x)
            {
                int32_t samps = sampbuffer[x];
                if (0 == (decode->decode_flags &
                          EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    int32_t tmp = samps - prevsamps;
                    prevsamps   = samps;
                    samps       = tmp;
                }

                UNPACK_SAMPLES (samps)

                srcbuffer += ((size_t) bpc) * ((size_t) samps);
                if (incr_tot) totsamps += (size_t) samps;
            }
        }
        sampbuffer += w;
    }

    return EXR_ERR_SUCCESS;
}